

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.cpp
# Opt level: O0

void __thiscall TasGrid::TasmanianSparseGrid::getPoints(TasmanianSparseGrid *this,double *x)

{
  int num_points;
  pointer pBVar1;
  double *x_local;
  TasmanianSparseGrid *this_local;
  
  pBVar1 = ::std::
           unique_ptr<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           ::operator->(&this->base);
  (*pBVar1->_vptr_BaseCanonicalGrid[0xb])(pBVar1,x);
  pBVar1 = ::std::
           unique_ptr<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           ::operator->(&this->base);
  num_points = BaseCanonicalGrid::getNumPoints(pBVar1);
  formTransformedPoints(this,num_points,x);
  return;
}

Assistant:

void TasmanianSparseGrid::getPoints(double *x) const{
    base->getPoints(x);
    formTransformedPoints(base->getNumPoints(), x);
}